

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

Try<std::error_code> * __thiscall
async_simple::coro::detail::LazyPromise<std::error_code>::tryResult
          (Try<std::error_code> *__return_storage_ptr__,LazyPromise<std::error_code> *this)

{
  error_category *peVar1;
  variant_alternative_t<1UL,_variant<monostate,_error_code,_exception_ptr>_> *pvVar2;
  variant_alternative_t<2UL,_variant<monostate,_error_code,_exception_ptr>_> *__other;
  exception_ptr eStack_18;
  
  if (*(__index_type *)
       ((long)&(this->_value).
               super__Variant_base<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
               .
               super__Move_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
               .
               super__Copy_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
               .
               super__Move_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
               .
               super__Copy_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
               .
               super__Variant_storage_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
       + 0x10) == '\x02') {
    __other = std::get<2ul,std::monostate,std::error_code,std::__exception_ptr::exception_ptr>
                        (&this->_value);
    std::__exception_ptr::exception_ptr::exception_ptr(&eStack_18,__other);
    std::variant<std::monostate,std::error_code,std::__exception_ptr::exception_ptr>::
    variant<std::__exception_ptr::exception_ptr&,void,void,std::__exception_ptr::exception_ptr,void>
              ((variant<std::monostate,std::error_code,std::__exception_ptr::exception_ptr> *)
               __return_storage_ptr__,&eStack_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  }
  else {
    pvVar2 = std::get<1ul,std::monostate,std::error_code,std::__exception_ptr::exception_ptr>
                       (&this->_value);
    peVar1 = pvVar2->_M_cat;
    *(undefined8 *)
     &(__return_storage_ptr__->_value).
      super__Variant_base<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>.
      super__Move_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
      .
      super__Copy_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
      .super__Move_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>.
      super__Copy_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>.
      super__Variant_storage_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
         = *(undefined8 *)pvVar2;
    *(error_category **)
     ((long)&(__return_storage_ptr__->_value).
             super__Variant_base<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Move_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Copy_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Move_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Copy_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Variant_storage_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
     + 8) = peVar1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->_value).
             super__Variant_base<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Move_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Copy_assign_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Move_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Copy_ctor_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             .
             super__Variant_storage_alias<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
     + 0x10) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }